

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

JSONWriter * __thiscall
hgdb::json::JSONWriter::value<std::basic_string_view<char,std::char_traits<char>>>
          (JSONWriter *this,basic_string_view<char,_std::char_traits<char>_> value)

{
  undefined1 *puVar1;
  ostream *poVar2;
  char *in_RCX;
  string_view value_00;
  string local_58;
  JSONWriter *local_38;
  
  value_00._M_len = value._M_str;
  puVar1 = &(this->s_).field_0x10;
  local_38 = this;
  poVar2 = std::operator<<((ostream *)puVar1,'\"');
  value_00._M_str = in_RCX;
  escape_abi_cxx11_(&local_58,(JSONWriter *)value._M_len,value_00);
  poVar2 = std::operator<<(poVar2,(string *)&local_58);
  std::operator<<(poVar2,'\"');
  std::__cxx11::string::~string((string *)&local_58);
  std::operator<<((ostream *)puVar1,',');
  return local_38;
}

Assistant:

JSONWriter &value(T value) {
        // if it's an array
        if constexpr (std::is_same_v<T, const char *> || std::is_same_v<T, std::string> ||
                      std::is_same_v<T, std::string_view>) {
            s_ << '"' << escape(value) << '"';
        } else if constexpr (std::is_same_v<T, bool>) {
            s_ << (value ? "true" : "false");
        } else {
            s_ << value;
        }
        s_ << ',';
        return *this;
    }